

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O2

uint32_t helper_uadd8_arm(uint32_t a,uint32_t b,void *gep)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar2 = (b & 0xff) + (a & 0xff);
  uVar5 = (b >> 8 & 0xff) + (a >> 8 & 0xff);
  uVar3 = (0xff < uVar2) + 2;
  if (uVar5 < 0x100) {
    uVar3 = (uint)(0xff < uVar2);
  }
  uVar6 = (b >> 0x10 & 0xff) + (a >> 0x10 & 0xff);
  uVar1 = uVar3 + 4;
  if (uVar6 < 0x100) {
    uVar1 = uVar3;
  }
  uVar3 = (b >> 0x18) + (a >> 0x18);
  uVar4 = uVar1 + 8;
  if (uVar3 < 0x100) {
    uVar4 = uVar1;
  }
  *(uint *)gep = uVar4;
  return uVar3 * 0x1000000 | uVar2 & 0xff | (uVar5 & 0xff) << 8 | (uVar6 & 0xff) << 0x10;
}

Assistant:

uint32_t HELPER(glue(PFX,add8))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    ADD8(a, b, 0);
    ADD8(a >> 8, b >> 8, 1);
    ADD8(a >> 16, b >> 16, 2);
    ADD8(a >> 24, b >> 24, 3);
    SET_GE;
    return res;
}